

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

BrotliDecoderErrorCode
duckdb_brotli::CopyUncompressedBlockToOutput
          (size_t *available_out,uint8_t **next_out,size_t *total_out,BrotliDecoderStateInternal *s)

{
  uint8_t **ppuVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  BrotliDecoderErrorCode BVar5;
  BrotliDecoderErrorCode BVar6;
  ulong uVar7;
  size_t __n;
  size_t sVar8;
  BrotliDecoderErrorCode unaff_EBP;
  uint8_t *__dest;
  bool bVar9;
  bool bVar10;
  
  iVar3 = BrotliEnsureRingBuffer(s);
  if (iVar3 == 0) {
    BVar6 = BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1;
  }
  else {
    do {
      do {
        if (s->substate_uncompressed == BROTLI_STATE_UNCOMPRESSED_WRITE) goto LAB_01c33a96;
      } while (s->substate_uncompressed != BROTLI_STATE_UNCOMPRESSED_NONE);
      uVar7 = (long)(s->br).last_in - (long)(s->br).next_in;
      iVar3 = 0x40000000;
      if (uVar7 < 0x40000001) {
        iVar3 = (int)((s->br).bit_pos_ >> 3) + (int)uVar7;
      }
      if (s->meta_block_remaining_len < iVar3) {
        iVar3 = s->meta_block_remaining_len;
      }
      iVar4 = s->pos;
      iVar2 = s->ringbuffer_size - iVar4;
      if (iVar4 + iVar3 <= s->ringbuffer_size) {
        iVar2 = iVar3;
      }
      __dest = s->ringbuffer + iVar4;
      __n = (size_t)iVar2;
      uVar7 = (s->br).bit_pos_;
      bVar9 = iVar2 != 0;
      if ((7 < uVar7) && (sVar8 = __n, iVar2 != 0)) {
        do {
          *__dest = (uint8_t)(s->br).val_;
          uVar7 = (s->br).bit_pos_ - 8;
          (s->br).bit_pos_ = uVar7;
          (s->br).val_ = (s->br).val_ >> 8;
          __dest = __dest + 1;
          __n = sVar8 - 1;
          bVar9 = sVar8 != 1;
          if (uVar7 < 8) break;
          bVar10 = sVar8 != 1;
          sVar8 = __n;
        } while (bVar10);
      }
      if (uVar7 < 0x40) {
        (s->br).val_ = (s->br).val_ & ~(-1L << ((byte)uVar7 & 0x3f));
      }
      if (bVar9) {
        switchD_015ff80e::default(__dest,(s->br).next_in,__n);
        ppuVar1 = &(s->br).next_in;
        *ppuVar1 = *ppuVar1 + __n;
      }
      iVar4 = s->pos + iVar2;
      s->pos = iVar4;
      iVar3 = s->meta_block_remaining_len;
      s->meta_block_remaining_len = iVar3 - iVar2;
      if (iVar4 < 1 << ((byte)(*(uint *)&s->field_0x304 >> 6) & 0x1f)) {
        return (uint)(iVar3 != iVar2) + BROTLI_DECODER_SUCCESS;
      }
      s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
LAB_01c33a96:
      BVar5 = WriteRingBuffer(s,available_out,next_out,total_out,0);
      BVar6 = BVar5;
      if (BVar5 == BROTLI_DECODER_SUCCESS) {
        if (s->ringbuffer_size == 1 << ((byte)(*(uint *)&s->field_0x304 >> 6) & 0x1f)) {
          s->max_distance = s->max_backward_distance;
        }
        s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
        BVar6 = unaff_EBP;
      }
      unaff_EBP = BVar6;
    } while (BVar5 == BROTLI_DECODER_SUCCESS);
  }
  return BVar6;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE CopyUncompressedBlockToOutput(size_t *available_out, uint8_t **next_out,
                                                                            size_t *total_out, BrotliDecoderState *s) {
	/* TODO(eustas): avoid allocation for single uncompressed block. */
	if (!BrotliEnsureRingBuffer(s)) {
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_RING_BUFFER_1);
	}

	/* State machine */
	for (;;) {
		switch (s->substate_uncompressed) {
		case BROTLI_STATE_UNCOMPRESSED_NONE: {
			int nbytes = (int)BrotliGetRemainingBytes(&s->br);
			if (nbytes > s->meta_block_remaining_len) {
				nbytes = s->meta_block_remaining_len;
			}
			if (s->pos + nbytes > s->ringbuffer_size) {
				nbytes = s->ringbuffer_size - s->pos;
			}
			/* Copy remaining bytes from s->br.buf_ to ring-buffer. */
			BrotliCopyBytes(&s->ringbuffer[s->pos], &s->br, (size_t)nbytes);
			s->pos += nbytes;
			s->meta_block_remaining_len -= nbytes;
			if (s->pos < 1 << s->window_bits) {
				if (s->meta_block_remaining_len == 0) {
					return BROTLI_DECODER_SUCCESS;
				}
				return BROTLI_DECODER_NEEDS_MORE_INPUT;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_WRITE;
		}
			/* Fall through. */

		case BROTLI_STATE_UNCOMPRESSED_WRITE: {
			BrotliDecoderErrorCode result;
			result = WriteRingBuffer(s, available_out, next_out, total_out, BROTLI_FALSE);
			if (result != BROTLI_DECODER_SUCCESS) {
				return result;
			}
			if (s->ringbuffer_size == 1 << s->window_bits) {
				s->max_distance = s->max_backward_distance;
			}
			s->substate_uncompressed = BROTLI_STATE_UNCOMPRESSED_NONE;
			break;
		}
		}
	}
	BROTLI_DCHECK(0); /* Unreachable */
}